

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

string * helics::generateFullCoreInitString_abi_cxx11_(FederateInfo *fedInfo)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  uint3 in_stack_ffffffffffffffec;
  uint __val;
  
  __val = (uint)in_stack_ffffffffffffffec;
  this = in_RDI;
  std::__cxx11::string::string
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)CONCAT34(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x405c01);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if (-1 < *(int *)((long)&in_RSI[2].field_2 + 4)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::to_string(__val);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    std::__cxx11::string::~string(this);
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x405cbe);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if ((in_RSI[2]._M_string_length & 0x10000000000) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if ((in_RSI[2]._M_string_length & 0x1000000000000) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if ((in_RSI[2]._M_string_length & 0x100000000000000) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if ((in_RSI[2].field_2._M_local_buf[9] & 1U) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if ((in_RSI[2].field_2._M_local_buf[10] & 1U) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x405d99);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x405de5);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x405e34);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x405e86);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if (((ulong)in_RSI[0xd]._M_dataplus._M_p & 1) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  }
  return this;
}

Assistant:

std::string generateFullCoreInitString(const FederateInfo& fedInfo)
{
    auto res = fedInfo.coreInitString;
    if (!fedInfo.broker.empty()) {
        res.append(" --broker=");
        res.append(fedInfo.broker);
    }
    if (fedInfo.brokerPort >= 0) {
        res.append(" --brokerport=");
        res.append(std::to_string(fedInfo.brokerPort));
    }
    if (!fedInfo.localport.empty()) {
        res.append(" --localport=");
        res.append(fedInfo.localport);
    }
    if (fedInfo.autobroker) {
        res.append(" --autobroker");
    }
    if (fedInfo.debugging) {
        res.append(" --debugging");
    }
    if (fedInfo.observer) {
        res.append(" --observer");
    }
    if (fedInfo.useJsonSerialization) {
        res.append(" --json");
    }
    if (fedInfo.encrypted) {
        res.append(" --encrypted");
    }
    if (!fedInfo.encryptionConfig.empty()) {
        res.append(" --encryption_config \"");
        res.append(fedInfo.encryptionConfig);
        res.append("\"");
    }
    if (!fedInfo.profilerFileName.empty()) {
        res.append(" --profiler \"");
        res.append(fedInfo.profilerFileName);
        res.append("\"");
    }
    if (!fedInfo.brokerInitString.empty()) {
        res.append(" --broker_init_string \"");
        res.append(fedInfo.brokerInitString);
        res.append("\"");
    }
    if (!fedInfo.key.empty()) {
        res += " --broker_key=";
        res.append(fedInfo.key);
    }
    if (fedInfo.fileInUse) {  // we used the file, specify a core section
        res += " --config_section=core --config-file='";
        res.append(fedInfo.configString);
        res.push_back('\'');
    }
    return res;
}